

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O0

MD_MARK * md_scan_left_for_resolved_mark
                    (MD_CTX *ctx,MD_MARK *mark_from,MD_OFFSET off,MD_MARK **p_cursor)

{
  MD_MARK *mark;
  MD_MARK **p_cursor_local;
  MD_OFFSET off_local;
  MD_MARK *mark_from_local;
  MD_CTX *ctx_local;
  
  for (mark = mark_from; ctx->marks <= mark; mark = mark + -1) {
    if ((mark->ch != 'D') && (mark->beg <= off)) {
      if ((mark->beg <= off) && ((off < mark->end && ((mark->flags & 0x10) != 0)))) {
        if (p_cursor != (MD_MARK **)0x0) {
          *p_cursor = mark;
        }
        return mark;
      }
      if (mark->end <= off) break;
    }
  }
  if (p_cursor != (MD_MARK **)0x0) {
    *p_cursor = mark;
  }
  return (MD_MARK *)0x0;
}

Assistant:

static MD_MARK*
md_scan_left_for_resolved_mark(MD_CTX* ctx, MD_MARK* mark_from, OFF off, MD_MARK** p_cursor)
{
    MD_MARK* mark;

    for(mark = mark_from; mark >= ctx->marks; mark--) {
        if(mark->ch == 'D'  ||  mark->beg > off)
            continue;
        if(mark->beg <= off  &&  off < mark->end  &&  (mark->flags & MD_MARK_RESOLVED)) {
            if(p_cursor != NULL)
                *p_cursor = mark;
            return mark;
        }
        if(mark->end <= off)
            break;
    }

    if(p_cursor != NULL)
        *p_cursor = mark;
    return NULL;
}